

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void * address_space_map_aarch64
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict12 *puVar1;
  uc_struct_conflict7 *puVar2;
  MemoryRegion *pMVar3;
  MemoryRegion *pMVar4;
  void *pvVar5;
  hwaddr done;
  hwaddr hVar6;
  ulong alignment;
  undefined1 lock;
  hwaddr *plen_00;
  hwaddr hVar7;
  hwaddr l;
  hwaddr *local_68;
  hwaddr local_60;
  MemTxAttrs local_54;
  AddressSpace *local_50;
  FlatView *local_48;
  hwaddr xlat;
  hwaddr xlat_1;
  
  hVar7 = *plen;
  if (hVar7 == 0) {
    return (void *)0x0;
  }
  puVar1 = as->uc;
  plen_00 = &l;
  local_48 = as->current_map;
  l = hVar7;
  local_68 = plen;
  local_54 = attrs;
  local_50 = as;
  pMVar3 = flatview_translate_aarch64
                     ((uc_struct_conflict2 *)as,local_48,addr,&xlat,plen_00,is_write,attrs);
  if ((is_write & pMVar3->ram) == 1) {
    if (pMVar3->readonly != false) {
LAB_0057886c:
      alignment = (ulong)-puVar1->init_target_page->mask;
      if (alignment <= l) {
        l = alignment;
      }
      pvVar5 = qemu_memalign(alignment,l);
      puVar2 = pMVar3->uc;
      (puVar2->bounce).buffer = pvVar5;
      (puVar2->bounce).addr = addr;
      (puVar2->bounce).len = l;
      (puVar2->bounce).mr = (MemoryRegion_conflict *)pMVar3;
      if (!is_write) {
        flatview_read((uc_struct_conflict2 *)local_50->uc,local_48,addr,(MemTxAttrs)0x1,pvVar5,l);
        pvVar5 = (pMVar3->uc->bounce).buffer;
      }
      *local_68 = l;
      return pvVar5;
    }
  }
  else if ((!is_write & pMVar3->ram) == 0) goto LAB_0057886c;
  local_60 = l;
  hVar6 = 0;
  while( true ) {
    lock = SUB81(plen_00,0);
    hVar6 = hVar6 + local_60;
    hVar7 = hVar7 - local_60;
    if (hVar7 == 0) break;
    addr = addr + local_60;
    plen_00 = &local_60;
    local_60 = hVar7;
    pMVar4 = flatview_translate_aarch64
                       ((uc_struct_conflict2 *)as,local_48,addr,&xlat_1,plen_00,is_write,local_54);
    lock = SUB81(plen_00,0);
    if ((pMVar4 != pMVar3) || (xlat_1 != xlat + hVar6)) break;
  }
  *local_68 = hVar6;
  pvVar5 = qemu_ram_ptr_length((uc_struct_conflict2 *)local_50->uc,pMVar3->ram_block,xlat,local_68,
                               (_Bool)lock);
  return pvVar5;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}